

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Course.hpp
# Opt level: O2

void __thiscall Course::displayCourseInfo(Course *this)

{
  int iVar1;
  ostream *poVar2;
  string asStack_38 [32];
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Course Name: ");
  (*(this->super_CourseComponent).super_Observer._vptr_Observer[3])(asStack_38,this);
  poVar2 = std::operator<<(poVar2,asStack_38);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string(asStack_38);
  poVar2 = std::operator<<((ostream *)&std::cout,"Number of Units: ");
  iVar1 = (*(this->super_CourseComponent).super_Observer._vptr_Observer[4])(this);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Course Description: ");
  (*(this->super_CourseComponent).super_Observer._vptr_Observer[7])(asStack_38,this);
  poVar2 = std::operator<<(poVar2,asStack_38);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string(asStack_38);
  return;
}

Assistant:

void displayCourseInfo() { 
            cout << "Course Name: " << getCourseName() << endl;
            cout << "Number of Units: " << getCourseUnits() << endl;
            cout << "Course Description: " << getCourseDescription() << endl;
        }